

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

Instr * __thiscall IR::Instr::GetInsertBeforeByteCodeUsesInstr(Instr *this)

{
  uint32 uVar1;
  uint32 uVar2;
  Instr *pIVar3;
  
  uVar1 = GetByteCodeOffset(this);
  do {
    pIVar3 = this;
    this = pIVar3->m_prev;
    if (this == (Instr *)0x0) {
      return pIVar3;
    }
    if (this->m_kind != InstrKindByteCodeUses) {
      return pIVar3;
    }
    if (this->m_opcode != ByteCodeUses) {
      return pIVar3;
    }
    uVar2 = GetByteCodeOffset(this);
  } while (uVar2 == uVar1);
  return pIVar3;
}

Assistant:

IR::Instr *Instr::GetInsertBeforeByteCodeUsesInstr()
{
    const uint32 byteCodeOffset = GetByteCodeOffset();
    IR::Instr *insertBeforeInstr = this;
    IR::Instr *prevInstr = insertBeforeInstr->m_prev;
    while(prevInstr && prevInstr->IsByteCodeUsesInstr() && prevInstr->GetByteCodeOffset() == byteCodeOffset)
    {
        insertBeforeInstr = prevInstr;
        prevInstr = prevInstr->m_prev;
    }
    return insertBeforeInstr;
}